

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrixUtil.hpp
# Opt level: O2

Matrix<double,_2,_4> * __thiscall
tcu::transpose<double,4,2>
          (Matrix<double,_2,_4> *__return_storage_ptr__,tcu *this,Matrix<double,_4,_2> *mat)

{
  long lVar1;
  
  Matrix<double,_2,_4>::Matrix(__return_storage_ptr__);
  for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 8) {
    *(undefined8 *)((long)(__return_storage_ptr__->m_data).m_data[0].m_data + lVar1 * 2) =
         *(undefined8 *)(this + lVar1);
    *(undefined8 *)((long)(__return_storage_ptr__->m_data).m_data[0].m_data + lVar1 * 2 + 8) =
         *(undefined8 *)(this + lVar1 + 0x20);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Matrix<T, Cols, Rows> transpose (const Matrix<T, Rows, Cols>& mat)
{
	Matrix<T, Cols, Rows> res;
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			res(col, row) = mat(row, col);
	return res;
}